

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

SimpleString StringFrom(void *value)

{
  size_t extraout_RDX;
  SimpleString SVar1;
  SimpleString local_38;
  SimpleString local_20;
  
  local_38.buffer_ = (char *)0x0;
  local_38.bufferSize_ = 0;
  SimpleString::copyBufferToNewInternalBuffer(&local_38,"0x");
  StringFromFormat((char *)&local_20,"%llx");
  SimpleString::operator+((SimpleString *)value,&local_38);
  SimpleString::deallocateInternalBuffer(&local_20);
  SimpleString::deallocateInternalBuffer(&local_38);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)value;
  return SVar1;
}

Assistant:

SimpleString StringFrom(const void* value)
{
    return SimpleString("0x") + HexStringFrom(value);
}